

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptTypedNumber.cpp
# Opt level: O0

Var Js::JavascriptTypedNumber<unsigned_long>::ToVar
              (unsigned_long value,ScriptContext *scriptContext)

{
  ScriptContext *value_00;
  bool bVar1;
  Recycler *pRVar2;
  JavascriptTypedNumber<unsigned_long> *this;
  JavascriptLibrary *this_00;
  StaticType *type;
  TrackAllocData local_50;
  JavascriptTypedNumber<unsigned_long> *number;
  ScriptContext *scriptContext_local;
  unsigned_long value_local;
  
  number = (JavascriptTypedNumber<unsigned_long> *)scriptContext;
  scriptContext_local = (ScriptContext *)value;
  bVar1 = TaggedInt::IsOverflow(value);
  if (bVar1) {
    pRVar2 = ScriptContext::GetRecycler((ScriptContext *)number);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptTypedNumber.cpp"
               ,0x1d);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
    this = (JavascriptTypedNumber<unsigned_long> *)new<Memory::Recycler>(0x18,pRVar2,0xa38830);
    value_00 = scriptContext_local;
    this_00 = ScriptContext::GetLibrary((ScriptContext *)number);
    type = JavascriptLibrary::GetUInt64TypeStatic(this_00);
    JavascriptTypedNumber(this,(unsigned_long)value_00,type);
    value_local = (unsigned_long)this;
  }
  else {
    value_local = (unsigned_long)TaggedInt::ToVarUnchecked((int)scriptContext_local);
  }
  return (Var)value_local;
}

Assistant:

Var JavascriptTypedNumber<unsigned __int64>::ToVar(unsigned __int64 value, ScriptContext* scriptContext)
    {
        if (!TaggedInt::IsOverflow(value))
        {
            return TaggedInt::ToVarUnchecked((uint)value);
        }
        JavascriptTypedNumber<unsigned __int64>* number = RecyclerNewLeaf(scriptContext->GetRecycler(), JavascriptUInt64Number, value,
            scriptContext->GetLibrary()->GetUInt64TypeStatic());
        return number;
    }